

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_decode_memory
               (uchar **out,uint *w,uint *h,uchar *in,size_t insize,LodePNGColorType colortype,
               uint bitdepth)

{
  undefined1 local_230 [8];
  LodePNGState state;
  uint error;
  LodePNGColorType colortype_local;
  size_t insize_local;
  uchar *in_local;
  uint *h_local;
  uint *w_local;
  uchar **out_local;
  
  state._500_4_ = colortype;
  lodepng_state_init((LodePNGState *)local_230);
  state.encoder.text_compression = state._500_4_;
  state.encoder._84_4_ = bitdepth;
  state.error = lodepng_decode(out,w,h,(LodePNGState *)local_230,in,insize);
  lodepng_state_cleanup((LodePNGState *)local_230);
  return state.error;
}

Assistant:

unsigned lodepng_decode_memory(unsigned char** out, unsigned* w, unsigned* h, const unsigned char* in,
                               size_t insize, LodePNGColorType colortype, unsigned bitdepth) {
  unsigned error;
  LodePNGState state;
  lodepng_state_init(&state);
  state.info_raw.colortype = colortype;
  state.info_raw.bitdepth = bitdepth;
  error = lodepng_decode(out, w, h, &state, in, insize);
  lodepng_state_cleanup(&state);
  return error;
}